

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cMultiBindTests.cpp
# Opt level: O0

void __thiscall gl4cts::MultiBind::Texture::Init(Texture *this,Context *context)

{
  Context *context_local;
  Texture *this_local;
  
  Release(this);
  this->m_context = context;
  return;
}

Assistant:

void Texture::Init(deqp::Context& context)
{
	Release();

	m_context = &context;
}